

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMfs.c
# Opt level: O0

Sfm_Ntk_t * Gia_ManExtractMfs(Gia_Man_t *p)

{
  Gia_Man_t *pGVar1;
  Tim_Man_t *p_00;
  Vec_Wrd_t *pVVar2;
  word wVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  Gia_Obj_t *pGVar8;
  Vec_Int_t *pVVar9;
  int *piVar10;
  word *pTruth_00;
  Sfm_Ntk_t *pSVar11;
  bool bVar12;
  word *local_1e8;
  word *local_1e0;
  Gia_Obj_t *local_1a0;
  int local_118;
  int local_114;
  int local_10c;
  int nWords_1;
  int w_1;
  int iBbOut;
  int iBbIn;
  int nWords;
  int w;
  int nLutSizeMax;
  int Counter;
  int nBbOuts;
  int nBbIns;
  int nMfsVars;
  int iFan;
  int Id;
  int nBoxOuts;
  int nBoxIns;
  int curCo;
  int curCi;
  int k;
  int j;
  int i;
  int nRealPos;
  int nRealPis;
  int nVars;
  int nBoxes;
  Tim_Man_t *pManTime;
  Vec_Int_t *vLeaves;
  Vec_Wrd_t *vTruths2;
  Vec_Int_t *vStarts;
  Vec_Int_t *vArray;
  Vec_Wrd_t *vTruths;
  Vec_Str_t *vEmpty;
  Vec_Str_t *vFixed;
  Vec_Wec_t *vFanins;
  Gia_Obj_t *pObjExtra;
  Gia_Obj_t *pObj;
  word uTruths6 [6];
  word **local_20;
  word *pTruth;
  word uTruth;
  Gia_Man_t *p_local;
  
  uTruth = (word)p;
  memset(&pObj,0,0x30);
  pObj = (Gia_Obj_t *)0xaaaaaaaaaaaaaaaa;
  uTruths6[0] = 0xcccccccccccccccc;
  uTruths6[1] = 0xf0f0f0f0f0f0f0f0;
  uTruths6[2] = 0xff00ff00ff00ff00;
  uTruths6[3] = 0xffff0000ffff0000;
  uTruths6[4] = 0xffffffff00000000;
  _nVars = *(Tim_Man_t **)(uTruth + 0x2d0);
  nRealPis = Gia_ManBoxNum((Gia_Man_t *)uTruth);
  if (nRealPis == 0) {
    local_114 = Gia_ManPiNum((Gia_Man_t *)uTruth);
  }
  else {
    local_114 = Tim_ManPiNum(_nVars);
  }
  i = local_114;
  if (nRealPis == 0) {
    local_118 = Gia_ManPoNum((Gia_Man_t *)uTruth);
  }
  else {
    local_118 = Tim_ManPoNum(_nVars);
  }
  j = local_118;
  Counter = 0;
  nLutSizeMax = 0;
  iVar4 = Gia_ManLutSizeMax((Gia_Man_t *)uTruth);
  iVar4 = Abc_MaxInt(iVar4,6);
  if (0xf < iVar4) {
    __assert_fail("nLutSizeMax < 16",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMfs.c"
                  ,0x4a,"Sfm_Ntk_t *Gia_ManExtractMfs(Gia_Man_t *)");
  }
  if (_nVars != (Tim_Man_t *)0x0) {
    Tim_ManBlackBoxIoNum(_nVars,&Counter,&nLutSizeMax);
  }
  w = nLutSizeMax;
  iVar5 = Gia_ManCiNum((Gia_Man_t *)uTruth);
  iVar6 = Gia_ManLutNum((Gia_Man_t *)uTruth);
  iVar7 = Gia_ManCoNum((Gia_Man_t *)uTruth);
  nBbOuts = iVar5 + 1 + iVar6 + iVar7 + Counter + nLutSizeMax;
  vFixed = (Vec_Str_t *)Vec_WecStart(nBbOuts);
  vEmpty = Vec_StrStart(nBbOuts);
  vTruths = (Vec_Wrd_t *)Vec_StrStart(nBbOuts);
  vArray = (Vec_Int_t *)Vec_WrdStart(nBbOuts);
  vTruths2 = (Vec_Wrd_t *)Vec_IntStart(nBbOuts);
  vLeaves = (Vec_Int_t *)Vec_WrdAlloc(10000);
  Gia_ManCleanCopyArray((Gia_Man_t *)uTruth);
  k = 0;
  while( true ) {
    iVar5 = k;
    iVar6 = Vec_IntSize(*(Vec_Int_t **)(uTruth + 0x40));
    wVar3 = uTruth;
    bVar12 = false;
    if (iVar5 < iVar6) {
      pGVar8 = Gia_ManCi((Gia_Man_t *)uTruth,k);
      nMfsVars = Gia_ObjId((Gia_Man_t *)wVar3,pGVar8);
      bVar12 = nMfsVars != 0;
    }
    if (!bVar12) break;
    Gia_ObjSetCopyArray((Gia_Man_t *)uTruth,nMfsVars,w);
    k = k + 1;
    w = w + 1;
  }
  Vec_StrWriteEntry(vEmpty,w,'\x01');
  Vec_WrdWriteEntry((Vec_Wrd_t *)vArray,w,0);
  Gia_ObjSetCopyArray((Gia_Man_t *)uTruth,0,w);
  pManTime = (Tim_Man_t *)Vec_IntAlloc(iVar4);
  Gia_ObjComputeTruthTableStart((Gia_Man_t *)uTruth,iVar4);
  w = w + 1;
  for (nMfsVars = 1; iVar4 = nMfsVars, iVar5 = Gia_ManObjNum((Gia_Man_t *)uTruth), iVar4 < iVar5;
      nMfsVars = nMfsVars + 1) {
    iVar4 = Gia_ObjIsLut((Gia_Man_t *)uTruth,nMfsVars);
    if (iVar4 != 0) {
      Vec_IntClear((Vec_Int_t *)pManTime);
      pVVar9 = Vec_WecEntry((Vec_Wec_t *)vFixed,w);
      vStarts = pVVar9;
      iVar4 = Gia_ObjLutSize((Gia_Man_t *)uTruth,nMfsVars);
      Vec_IntGrow(pVVar9,iVar4);
      for (curCo = 0; iVar4 = curCo, iVar5 = Gia_ObjLutSize((Gia_Man_t *)uTruth,nMfsVars),
          iVar4 < iVar5; curCo = curCo + 1) {
        piVar10 = Gia_ObjLutFanins((Gia_Man_t *)uTruth,nMfsVars);
        nBbIns = piVar10[curCo];
        iVar4 = Gia_ObjCopyArray((Gia_Man_t *)uTruth,nBbIns);
        pVVar9 = vStarts;
        if (iVar4 < 0) {
          __assert_fail("Gia_ObjCopyArray(p, iFan) >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMfs.c"
                        ,0x69,"Sfm_Ntk_t *Gia_ManExtractMfs(Gia_Man_t *)");
        }
        iVar4 = Gia_ObjCopyArray((Gia_Man_t *)uTruth,nBbIns);
        Vec_IntPush(pVVar9,iVar4);
        Vec_IntPush((Vec_Int_t *)pManTime,nBbIns);
      }
      iVar4 = Vec_IntSize((Vec_Int_t *)pManTime);
      if (0xf < iVar4) {
        __assert_fail("Vec_IntSize(vLeaves) < 16",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMfs.c"
                      ,0x6d,"Sfm_Ntk_t *Gia_ManExtractMfs(Gia_Man_t *)");
      }
      iVar4 = Vec_IntSize((Vec_Int_t *)pManTime);
      iVar5 = Gia_ObjLutSize((Gia_Man_t *)uTruth,nMfsVars);
      wVar3 = uTruth;
      if (iVar4 != iVar5) {
        __assert_fail("Vec_IntSize(vLeaves) == Gia_ObjLutSize(p, Id)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMfs.c"
                      ,0x6e,"Sfm_Ntk_t *Gia_ManExtractMfs(Gia_Man_t *)");
      }
      pGVar8 = Gia_ManObj((Gia_Man_t *)uTruth,nMfsVars);
      pTruth_00 = Gia_ObjComputeTruthTableCut((Gia_Man_t *)wVar3,pGVar8,(Vec_Int_t *)pManTime);
      piVar10 = Vec_IntArray(vStarts);
      iVar4 = Vec_IntSize(vStarts);
      iVar5 = Vec_IntSize((Vec_Int_t *)pManTime);
      nRealPos = Abc_TtMinBase(pTruth_00,piVar10,iVar4,iVar5);
      Vec_IntShrink(vStarts,nRealPos);
      if (nRealPos < 7) {
        Vec_WrdWriteEntry((Vec_Wrd_t *)vArray,w,*pTruth_00);
      }
      else {
        iVar4 = Abc_Truth6WordNum(nRealPos);
        pVVar2 = vTruths2;
        iVar5 = Vec_WrdSize((Vec_Wrd_t *)vLeaves);
        Vec_IntWriteEntry((Vec_Int_t *)pVVar2,w,iVar5);
        for (iBbIn = 0; iBbIn < iVar4; iBbIn = iBbIn + 1) {
          Vec_WrdPush((Vec_Wrd_t *)vLeaves,pTruth_00[iBbIn]);
        }
      }
      iVar4 = Gia_ObjLutIsMux((Gia_Man_t *)uTruth,nMfsVars);
      if (iVar4 != 0) {
        Vec_StrWriteEntry(vEmpty,w,'\x01');
        Vec_StrWriteEntry((Vec_Str_t *)vTruths,w,'\x01');
      }
      Gia_ObjSetCopyArray((Gia_Man_t *)uTruth,nMfsVars,w);
      w = w + 1;
    }
  }
  Gia_ObjComputeTruthTableStop((Gia_Man_t *)uTruth);
  k = 0;
  while( true ) {
    iVar4 = k;
    iVar5 = Vec_IntSize(*(Vec_Int_t **)(uTruth + 0x48));
    bVar12 = false;
    if (iVar4 < iVar5) {
      pObjExtra = Gia_ManCo((Gia_Man_t *)uTruth,k);
      bVar12 = pObjExtra != (Gia_Obj_t *)0x0;
    }
    if (!bVar12) break;
    nBbIns = Gia_ObjFaninId0p((Gia_Man_t *)uTruth,pObjExtra);
    iVar4 = Gia_ObjCopyArray((Gia_Man_t *)uTruth,nBbIns);
    if (iVar4 < 0) {
      __assert_fail("Gia_ObjCopyArray(p, iFan) >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMfs.c"
                    ,0x89,"Sfm_Ntk_t *Gia_ManExtractMfs(Gia_Man_t *)");
    }
    pVVar9 = Vec_WecEntry((Vec_Wec_t *)vFixed,w);
    vStarts = pVVar9;
    iVar4 = Gia_ObjCopyArray((Gia_Man_t *)uTruth,nBbIns);
    Vec_IntFill(pVVar9,1,iVar4);
    iVar4 = k;
    iVar5 = Gia_ManCoNum((Gia_Man_t *)uTruth);
    if (iVar4 < iVar5 - j) {
      Vec_StrWriteEntry(vEmpty,w,'\x01');
      Vec_StrWriteEntry((Vec_Str_t *)vTruths,w,'\x01');
      iVar4 = Gia_ObjFaninC0(pObjExtra);
      if (iVar4 == 0) {
        local_1a0 = pObj;
      }
      else {
        local_1a0 = (Gia_Obj_t *)((ulong)pObj ^ 0xffffffffffffffff);
      }
      pTruth = (word *)local_1a0;
      Vec_WrdWriteEntry((Vec_Wrd_t *)vArray,w,(word)local_1a0);
    }
    wVar3 = uTruth;
    iVar4 = Gia_ObjId((Gia_Man_t *)uTruth,pObjExtra);
    Gia_ObjSetCopyArray((Gia_Man_t *)wVar3,iVar4,w);
    k = k + 1;
    w = w + 1;
  }
  if (Counter + w != nBbOuts) {
    __assert_fail("Counter == nMfsVars",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMfs.c"
                  ,0x97,"Sfm_Ntk_t *Gia_ManExtractMfs(Gia_Man_t *)");
  }
  if (*(long *)(uTruth + 0x210) != 0) {
    w_1 = 0;
    nWords_1 = 0;
    iVar4 = Gia_ManCiNum(*(Gia_Man_t **)(uTruth + 0x210));
    if (0xf < iVar4) {
      __assert_fail("Gia_ManCiNum(p->pAigExtra) < 16",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMfs.c"
                    ,0x9c,"Sfm_Ntk_t *Gia_ManExtractMfs(Gia_Man_t *)");
    }
    pGVar1 = *(Gia_Man_t **)(uTruth + 0x210);
    iVar4 = Gia_ManCiNum(*(Gia_Man_t **)(uTruth + 0x210));
    Gia_ObjComputeTruthTableStart(pGVar1,iVar4);
    nBoxIns = i;
    nBoxOuts = 0;
    for (curCo = 0; curCo < nRealPis; curCo = curCo + 1) {
      Id = Tim_ManBoxInputNum(_nVars,curCo);
      iFan = Tim_ManBoxOutputNum(_nVars,curCo);
      iVar4 = Tim_ManBoxIsBlack(_nVars,curCo);
      if (iVar4 == 0) {
        Vec_IntClear((Vec_Int_t *)pManTime);
        for (k = 0; p_00 = pManTime, k < Id; k = k + 1) {
          pGVar1 = *(Gia_Man_t **)(uTruth + 0x210);
          pGVar8 = Gia_ManCi(*(Gia_Man_t **)(uTruth + 0x210),k);
          iVar4 = Gia_ObjId(pGVar1,pGVar8);
          Vec_IntPush((Vec_Int_t *)p_00,iVar4);
        }
        for (curCi = 0; curCi < iFan; curCi = curCi + 1) {
          pObjExtra = Gia_ManCi((Gia_Man_t *)uTruth,nBoxIns + curCi);
          wVar3 = uTruth;
          iVar4 = Gia_ObjId((Gia_Man_t *)uTruth,pObjExtra);
          iVar4 = Gia_ObjCopyArray((Gia_Man_t *)wVar3,iVar4);
          vStarts = Vec_WecEntry((Vec_Wec_t *)vFixed,iVar4);
          Vec_IntGrow(vStarts,Id);
          for (k = 0; wVar3 = uTruth, k < Id; k = k + 1) {
            pGVar8 = Gia_ManCo((Gia_Man_t *)uTruth,nBoxOuts + k);
            nBbIns = Gia_ObjId((Gia_Man_t *)wVar3,pGVar8);
            iVar5 = Gia_ObjCopyArray((Gia_Man_t *)uTruth,nBbIns);
            pVVar9 = vStarts;
            if (iVar5 < 0) {
              __assert_fail("Gia_ObjCopyArray(p, iFan) >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMfs.c"
                            ,0xb6,"Sfm_Ntk_t *Gia_ManExtractMfs(Gia_Man_t *)");
            }
            iVar5 = Gia_ObjCopyArray((Gia_Man_t *)uTruth,nBbIns);
            Vec_IntPush(pVVar9,iVar5);
          }
          Vec_StrWriteEntry(vEmpty,iVar4,'\x01');
          vFanins = (Vec_Wec_t *)Gia_ManCo(*(Gia_Man_t **)(uTruth + 0x210),(nBoxIns - i) + curCi);
          iVar5 = Gia_ObjFaninId0p(*(Gia_Man_t **)(uTruth + 0x210),(Gia_Obj_t *)vFanins);
          if (iVar5 == 0) {
            pTruth = (word *)0x0;
            iVar5 = Gia_ObjFaninC0((Gia_Obj_t *)vFanins);
            if (iVar5 == 0) {
              local_1e0 = pTruth;
            }
            else {
              local_1e0 = (word *)((ulong)pTruth ^ 0xffffffffffffffff);
            }
            pTruth = local_1e0;
            local_20 = &pTruth;
          }
          else {
            pGVar8 = Gia_ObjFanin0((Gia_Obj_t *)vFanins);
            iVar5 = Gia_ObjIsCi(pGVar8);
            if (iVar5 == 0) {
              pGVar1 = *(Gia_Man_t **)(uTruth + 0x210);
              pGVar8 = Gia_ObjFanin0((Gia_Obj_t *)vFanins);
              local_20 = (word **)Gia_ObjComputeTruthTableCut(pGVar1,pGVar8,(Vec_Int_t *)pManTime);
              iVar5 = Gia_ObjFaninC0((Gia_Obj_t *)vFanins);
              if (iVar5 != 0) {
                iVar5 = Vec_IntSize((Vec_Int_t *)pManTime);
                iVar5 = Abc_Truth6WordNum(iVar5);
                Abc_TtNot((word *)local_20,iVar5);
              }
            }
            else {
              pGVar8 = Gia_ObjFanin0((Gia_Obj_t *)vFanins);
              iVar5 = Gia_ObjCioId(pGVar8);
              pTruth = (word *)uTruths6[(long)iVar5 + -1];
              iVar5 = Gia_ObjFaninC0((Gia_Obj_t *)vFanins);
              if (iVar5 == 0) {
                local_1e8 = pTruth;
              }
              else {
                local_1e8 = (word *)((ulong)pTruth ^ 0xffffffffffffffff);
              }
              pTruth = local_1e8;
              local_20 = &pTruth;
            }
          }
          piVar10 = Vec_IntArray(vStarts);
          iVar5 = Vec_IntSize(vStarts);
          iVar6 = Vec_IntSize((Vec_Int_t *)pManTime);
          nRealPos = Abc_TtMinBase((word *)local_20,piVar10,iVar5,iVar6);
          Vec_IntShrink(vStarts,nRealPos);
          if (nRealPos < 7) {
            Vec_WrdWriteEntry((Vec_Wrd_t *)vArray,iVar4,(word)*local_20);
          }
          else {
            iVar5 = Abc_Truth6WordNum(nRealPos);
            pVVar2 = vTruths2;
            iVar6 = Vec_WrdSize((Vec_Wrd_t *)vLeaves);
            Vec_IntWriteEntry((Vec_Int_t *)pVVar2,iVar4,iVar6);
            for (local_10c = 0; local_10c < iVar5; local_10c = local_10c + 1) {
              Vec_WrdPush((Vec_Wrd_t *)vLeaves,(word)local_20[local_10c]);
            }
          }
        }
      }
      else {
        for (curCi = 0; curCi < iFan; curCi = curCi + 1) {
          pObjExtra = Gia_ManCi((Gia_Man_t *)uTruth,nBoxIns + curCi);
          wVar3 = uTruth;
          iVar4 = Gia_ObjId((Gia_Man_t *)uTruth,pObjExtra);
          iVar4 = Gia_ObjCopyArray((Gia_Man_t *)wVar3,iVar4);
          vStarts = Vec_WecEntry((Vec_Wec_t *)vFixed,iVar4);
          iVar5 = Vec_IntSize(vStarts);
          if (iVar5 != 0) {
            __assert_fail("Vec_IntSize(vArray) == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMfs.c"
                          ,0xe9,"Sfm_Ntk_t *Gia_ManExtractMfs(Gia_Man_t *)");
          }
          Vec_IntFill(vStarts,1,nWords_1);
          Vec_StrWriteEntry(vEmpty,iVar4,'\x01');
          Vec_StrWriteEntry((Vec_Str_t *)vTruths,iVar4,'\x01');
          Vec_WrdWriteEntry((Vec_Wrd_t *)vArray,iVar4,(word)pObj);
          nWords_1 = nWords_1 + 1;
        }
        for (k = 0; k < Id; k = k + 1) {
          pObjExtra = Gia_ManCo((Gia_Man_t *)uTruth,nBoxOuts + k);
          wVar3 = uTruth;
          iVar4 = Gia_ObjId((Gia_Man_t *)uTruth,pObjExtra);
          iVar4 = Gia_ObjCopyArray((Gia_Man_t *)wVar3,iVar4);
          vStarts = Vec_WecEntry((Vec_Wec_t *)vFixed,(nBbOuts - Counter) + w_1);
          iVar5 = Vec_IntSize(vStarts);
          if (iVar5 != 0) {
            __assert_fail("Vec_IntSize(vArray) == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMfs.c"
                          ,0xf6,"Sfm_Ntk_t *Gia_ManExtractMfs(Gia_Man_t *)");
          }
          Vec_IntFill(vStarts,1,iVar4);
          w_1 = w_1 + 1;
        }
      }
      for (k = 0; k < Id; k = k + 1) {
        pObjExtra = Gia_ManCo((Gia_Man_t *)uTruth,nBoxOuts + k);
        pGVar8 = Gia_ObjFanin0(pObjExtra);
        iVar4 = Gia_ObjIsCi(pGVar8);
        wVar3 = uTruth;
        if (iVar4 != 0) {
          iVar4 = Gia_ObjFaninId0p((Gia_Man_t *)uTruth,pObjExtra);
          iVar4 = Gia_ObjCopyArray((Gia_Man_t *)wVar3,iVar4);
          Vec_StrWriteEntry((Vec_Str_t *)vTruths,iVar4,'\x01');
        }
      }
      nBoxOuts = Id + nBoxOuts;
      nBoxIns = iFan + nBoxIns;
    }
    nBoxOuts = j + nBoxOuts;
    Gia_ObjComputeTruthTableStop(*(Gia_Man_t **)(uTruth + 0x210));
    iVar5 = nBoxIns;
    iVar6 = Gia_ManCiNum((Gia_Man_t *)uTruth);
    iVar4 = nBoxOuts;
    if (iVar5 != iVar6) {
      __assert_fail("curCi == Gia_ManCiNum(p)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMfs.c"
                    ,0x109,"Sfm_Ntk_t *Gia_ManExtractMfs(Gia_Man_t *)");
    }
    iVar5 = Gia_ManCoNum((Gia_Man_t *)uTruth);
    if (iVar4 != iVar5) {
      __assert_fail("curCo == Gia_ManCoNum(p)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMfs.c"
                    ,0x10a,"Sfm_Ntk_t *Gia_ManExtractMfs(Gia_Man_t *)");
    }
    iVar4 = nBoxIns - i;
    iVar5 = Gia_ManCoNum(*(Gia_Man_t **)(uTruth + 0x210));
    if (iVar4 != iVar5) {
      __assert_fail("curCi - nRealPis == Gia_ManCoNum(p->pAigExtra)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMfs.c"
                    ,0x10b,"Sfm_Ntk_t *Gia_ManExtractMfs(Gia_Man_t *)");
    }
    if (w_1 != Counter) {
      __assert_fail("iBbIn == nBbIns",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMfs.c"
                    ,0x10c,"Sfm_Ntk_t *Gia_ManExtractMfs(Gia_Man_t *)");
    }
    if (nWords_1 != nLutSizeMax) {
      __assert_fail("iBbOut == nBbOuts",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMfs.c"
                    ,0x10d,"Sfm_Ntk_t *Gia_ManExtractMfs(Gia_Man_t *)");
    }
  }
  Vec_IntFree((Vec_Int_t *)pManTime);
  pSVar11 = Sfm_NtkConstruct((Vec_Wec_t *)vFixed,nLutSizeMax + i,j + Counter,vEmpty,
                             (Vec_Str_t *)vTruths,(Vec_Wrd_t *)vArray,(Vec_Int_t *)vTruths2,
                             (Vec_Wrd_t *)vLeaves);
  return pSVar11;
}

Assistant:

ABC_NAMESPACE_IMPL_START

////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    []

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Sfm_Ntk_t * Gia_ManExtractMfs( Gia_Man_t * p )
{
    word uTruth, * pTruth, uTruths6[6] = {
        ABC_CONST(0xAAAAAAAAAAAAAAAA),
        ABC_CONST(0xCCCCCCCCCCCCCCCC),
        ABC_CONST(0xF0F0F0F0F0F0F0F0),
        ABC_CONST(0xFF00FF00FF00FF00),
        ABC_CONST(0xFFFF0000FFFF0000),
        ABC_CONST(0xFFFFFFFF00000000)
    };
    Gia_Obj_t * pObj, * pObjExtra;
    Vec_Wec_t * vFanins; // mfs data
    Vec_Str_t * vFixed;  // mfs data 
    Vec_Str_t * vEmpty;  // mfs data
    Vec_Wrd_t * vTruths; // mfs data
    Vec_Int_t * vArray;
    Vec_Int_t * vStarts;
    Vec_Wrd_t * vTruths2;
    Vec_Int_t * vLeaves;
    Tim_Man_t * pManTime = (Tim_Man_t *)p->pManTime;
    int nBoxes   = Gia_ManBoxNum(p), nVars;
    int nRealPis = nBoxes ? Tim_ManPiNum(pManTime) : Gia_ManPiNum(p);
    int nRealPos = nBoxes ? Tim_ManPoNum(pManTime) : Gia_ManPoNum(p);
    int i, j, k, curCi, curCo, nBoxIns, nBoxOuts;
    int Id, iFan, nMfsVars, nBbIns = 0, nBbOuts = 0, Counter = 0;
    int nLutSizeMax = Gia_ManLutSizeMax( p );
    nLutSizeMax = Abc_MaxInt( nLutSizeMax, 6 );
    assert( nLutSizeMax < 16 );
    //assert( !p->pAigExtra || Gia_ManPiNum(p->pAigExtra) <= 6 );
    if ( pManTime ) Tim_ManBlackBoxIoNum( pManTime, &nBbIns, &nBbOuts );
    // skip PIs due to box outputs
    Counter += nBbOuts;
    // prepare storage
    nMfsVars = Gia_ManCiNum(p) + 1 + Gia_ManLutNum(p) + Gia_ManCoNum(p) + nBbIns + nBbOuts;
    vFanins  = Vec_WecStart( nMfsVars );
    vFixed   = Vec_StrStart( nMfsVars );
    vEmpty   = Vec_StrStart( nMfsVars );
    vTruths  = Vec_WrdStart( nMfsVars );
    vStarts  = Vec_IntStart( nMfsVars );
    vTruths2 = Vec_WrdAlloc( 10000 );
    // set internal PIs
    Gia_ManCleanCopyArray( p );
    Gia_ManForEachCiId( p, Id, i )
        Gia_ObjSetCopyArray( p, Id, Counter++ );
    // set constant node
    Vec_StrWriteEntry( vFixed, Counter, (char)1 );
    Vec_WrdWriteEntry( vTruths, Counter, (word)0 );
    Gia_ObjSetCopyArray( p, 0, Counter++ );
    // set internal LUTs
    vLeaves = Vec_IntAlloc( nLutSizeMax );
    Gia_ObjComputeTruthTableStart( p, nLutSizeMax );
    Gia_ManForEachLut( p, Id )
    {
        Vec_IntClear( vLeaves );
        vArray = Vec_WecEntry( vFanins, Counter );
        Vec_IntGrow( vArray, Gia_ObjLutSize(p, Id) );
        Gia_LutForEachFanin( p, Id, iFan, k )
        {
            assert( Gia_ObjCopyArray(p, iFan) >= 0 );
            Vec_IntPush( vArray, Gia_ObjCopyArray(p, iFan) );
            Vec_IntPush( vLeaves, iFan );
        }
        assert( Vec_IntSize(vLeaves) < 16 );
        assert( Vec_IntSize(vLeaves) == Gia_ObjLutSize(p, Id) );
//        uTruth = *Gia_ObjComputeTruthTableCut( p, Gia_ManObj(p, Id), vLeaves );
//        nVars = Abc_Tt6MinBase( &uTruth, Vec_IntArray(vArray), Vec_IntSize(vArray) );
        pTruth = Gia_ObjComputeTruthTableCut( p, Gia_ManObj(p, Id), vLeaves );
        nVars = Abc_TtMinBase( pTruth, Vec_IntArray(vArray), Vec_IntSize(vArray), Vec_IntSize(vLeaves) );
        Vec_IntShrink( vArray, nVars );
        if ( nVars <= 6 )
            Vec_WrdWriteEntry( vTruths, Counter, pTruth[0] );
        else
        {
            int w, nWords = Abc_Truth6WordNum( nVars );
            Vec_IntWriteEntry( vStarts, Counter, Vec_WrdSize(vTruths2) );
            for ( w = 0; w < nWords; w++ )
                Vec_WrdPush( vTruths2, pTruth[w] );
        }
        if ( Gia_ObjLutIsMux(p, Id) )
        {
            Vec_StrWriteEntry( vFixed, Counter, (char)1 );
            Vec_StrWriteEntry( vEmpty, Counter, (char)1 );
        }
        Gia_ObjSetCopyArray( p, Id, Counter++ );
    }
    Gia_ObjComputeTruthTableStop( p );
    // set all POs
    Gia_ManForEachCo( p, pObj, i )
    {
        iFan = Gia_ObjFaninId0p( p, pObj );
        assert( Gia_ObjCopyArray(p, iFan) >= 0 );
        vArray = Vec_WecEntry( vFanins, Counter );
        Vec_IntFill( vArray, 1, Gia_ObjCopyArray(p, iFan) );
        if ( i < Gia_ManCoNum(p) - nRealPos ) // internal PO
        {
            Vec_StrWriteEntry( vFixed, Counter, (char)1 );
            Vec_StrWriteEntry( vEmpty, Counter, (char)1 );
            uTruth = Gia_ObjFaninC0(pObj) ? ~uTruths6[0]: uTruths6[0];
            Vec_WrdWriteEntry( vTruths, Counter, uTruth );
        }
        Gia_ObjSetCopyArray( p, Gia_ObjId(p, pObj), Counter++ );
    }
    // skip POs due to box inputs
    Counter += nBbIns;
    assert( Counter == nMfsVars );
    // add functions of the boxes
    if ( p->pAigExtra )
    {
        int iBbIn = 0, iBbOut = 0;
        assert( Gia_ManCiNum(p->pAigExtra) < 16 );
        Gia_ObjComputeTruthTableStart( p->pAigExtra, Gia_ManCiNum(p->pAigExtra) );
        curCi = nRealPis;
        curCo = 0;
        for ( k = 0; k < nBoxes; k++ )
        {
            nBoxIns = Tim_ManBoxInputNum( pManTime, k );
            nBoxOuts = Tim_ManBoxOutputNum( pManTime, k );
            // iterate through box outputs
            if ( !Tim_ManBoxIsBlack(pManTime, k) ) //&& Tim_ManBoxInputNum(pManTime, k) <= 6 )
            {
                // collect truth table leaves
                Vec_IntClear( vLeaves );
                for ( i = 0; i < nBoxIns; i++ )
                    Vec_IntPush( vLeaves, Gia_ObjId(p->pAigExtra, Gia_ManCi(p->pAigExtra, i)) );
                for ( j = 0; j < nBoxOuts; j++ )
                {
                    // CI corresponding to the box outputs
                    pObj = Gia_ManCi( p, curCi + j );
                    Counter = Gia_ObjCopyArray( p, Gia_ObjId(p, pObj) );
                    // add box inputs (POs of the AIG) as fanins
                    vArray = Vec_WecEntry( vFanins, Counter );
                    Vec_IntGrow( vArray, nBoxIns );
                    for ( i = 0; i < nBoxIns; i++ )
                    {
                        iFan = Gia_ObjId( p, Gia_ManCo(p, curCo + i) );
                        assert( Gia_ObjCopyArray(p, iFan) >= 0 );
                        Vec_IntPush( vArray, Gia_ObjCopyArray(p, iFan) );
                    }
                    Vec_StrWriteEntry( vFixed, Counter, (char)1 );
                    // box output in the extra manager
                    pObjExtra = Gia_ManCo( p->pAigExtra, curCi - nRealPis + j );
                    // compute truth table
                    pTruth = NULL;
                    if ( Gia_ObjFaninId0p(p->pAigExtra, pObjExtra) == 0 )
                    {
                        uTruth = 0;
                        uTruth = Gia_ObjFaninC0(pObjExtra) ? ~uTruth : uTruth;
                        pTruth = &uTruth;
                    }
                    else if ( Gia_ObjIsCi(Gia_ObjFanin0(pObjExtra)) )
                    {
                        uTruth = uTruths6[Gia_ObjCioId(Gia_ObjFanin0(pObjExtra))];
                        uTruth = Gia_ObjFaninC0(pObjExtra) ? ~uTruth : uTruth;
                        pTruth = &uTruth;
                    }
                    else
                    {
                        pTruth = Gia_ObjComputeTruthTableCut( p->pAigExtra, Gia_ObjFanin0(pObjExtra), vLeaves );
                        if ( Gia_ObjFaninC0(pObjExtra) )
                            Abc_TtNot( pTruth, Abc_Truth6WordNum(Vec_IntSize(vLeaves)) );
                    }
                    //uTruth = Gia_ObjFaninC0(pObjExtra) ? ~uTruth : uTruth;
                    //Dau_DsdPrintFromTruth( &uTruth, Vec_IntSize(vArray) );
                    //nVars = Abc_Tt6MinBase( &uTruth, Vec_IntArray(vArray), Vec_IntSize(vArray) );
                    nVars = Abc_TtMinBase( pTruth, Vec_IntArray(vArray), Vec_IntSize(vArray), Vec_IntSize(vLeaves) );
                    Vec_IntShrink( vArray, nVars );
                    if ( nVars <= 6 )
                        Vec_WrdWriteEntry( vTruths, Counter, pTruth[0] );
                    else
                    {
                        int w, nWords = Abc_Truth6WordNum( nVars );
                        Vec_IntWriteEntry( vStarts, Counter, Vec_WrdSize(vTruths2) );
                        for ( w = 0; w < nWords; w++ )
                            Vec_WrdPush( vTruths2, pTruth[w] );
                    }
                }
            }
            else // create buffers for black box inputs and outputs
            {
                for ( j = 0; j < nBoxOuts; j++ )
                {
                    // CI corresponding to the box outputs
                    pObj = Gia_ManCi( p, curCi + j );
                    Counter = Gia_ObjCopyArray( p, Gia_ObjId(p, pObj) );
                    // connect it with the special primary input (iBbOut)
                    vArray = Vec_WecEntry( vFanins, Counter );
                    assert( Vec_IntSize(vArray) == 0 );
                    Vec_IntFill( vArray, 1, iBbOut++ );
                    Vec_StrWriteEntry( vFixed, Counter, (char)1 );
                    Vec_StrWriteEntry( vEmpty, Counter, (char)1 );
                    Vec_WrdWriteEntry( vTruths, Counter, uTruths6[0] );
                }
                for ( i = 0; i < nBoxIns; i++ )
                {
                    // CO corresponding to the box inputs
                    pObj = Gia_ManCo( p, curCo + i );
                    Counter = Gia_ObjCopyArray( p, Gia_ObjId(p, pObj) );
                    // connect it with the special primary output (iBbIn)
                    vArray = Vec_WecEntry( vFanins, nMfsVars - nBbIns + iBbIn++ );
                    assert( Vec_IntSize(vArray) == 0 );
                    Vec_IntFill( vArray, 1, Counter );
                }
            }
            // set internal POs pointing directly to internal PIs as no-delay
            for ( i = 0; i < nBoxIns; i++ )
            {
                pObj = Gia_ManCo( p, curCo + i );
                if ( !Gia_ObjIsCi( Gia_ObjFanin0(pObj) ) )
                    continue;
                Counter = Gia_ObjCopyArray( p, Gia_ObjFaninId0p(p, pObj) );
                Vec_StrWriteEntry( vEmpty, Counter, (char)1 );
            }
            curCo += nBoxIns;
            curCi += nBoxOuts;
        }
        curCo += nRealPos;
        Gia_ObjComputeTruthTableStop( p->pAigExtra );
        // verify counts
        assert( curCi == Gia_ManCiNum(p) );
        assert( curCo == Gia_ManCoNum(p) );
        assert( curCi - nRealPis == Gia_ManCoNum(p->pAigExtra) );
        assert( iBbIn  == nBbIns );
        assert( iBbOut == nBbOuts );
    }
    // finalize 
    Vec_IntFree( vLeaves );
    return Sfm_NtkConstruct( vFanins, nBbOuts + nRealPis, nRealPos + nBbIns, vFixed, vEmpty, vTruths, vStarts, vTruths2 );
}